

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O2

void GB(uint64_t *a,uint64_t *b,uint64_t *c,uint64_t *d)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = *a + *b + (*b & 0xffffffff) * (*a & 0xffffffff) * 2;
  *a = uVar1;
  uVar1 = uVar1 ^ *d;
  uVar2 = uVar1 >> 0x20;
  uVar1 = uVar1 << 0x20 | uVar2;
  *d = uVar1;
  uVar1 = uVar1 + *c + uVar2 * (*c & 0xffffffff) * 2;
  *c = uVar1;
  uVar1 = uVar1 ^ *b;
  uVar2 = uVar1 >> 0x18;
  uVar1 = uVar1 << 0x28 | uVar2;
  *b = uVar1;
  uVar1 = uVar1 + *a + (uVar2 & 0xffffffff) * (*a & 0xffffffff) * 2;
  *a = uVar1;
  uVar1 = uVar1 ^ *d;
  uVar2 = uVar1 >> 0x10;
  uVar1 = uVar1 << 0x30 | uVar2;
  *d = uVar1;
  uVar2 = uVar1 + *c + (uVar2 & 0xffffffff) * (*c & 0xffffffff) * 2;
  *c = uVar2;
  uVar2 = uVar2 ^ *b;
  *b = uVar2 << 1 | (ulong)((long)uVar2 < 0);
  return;
}

Assistant:

static inline void GB(uint64_t *a, uint64_t *b, uint64_t *c, uint64_t *d)
{
    *a += *b + 2 * trunc32(*a) * trunc32(*b);
    *d = ror(*d ^ *a, 32);
    *c += *d + 2 * trunc32(*c) * trunc32(*d);
    *b = ror(*b ^ *c, 24);
    *a += *b + 2 * trunc32(*a) * trunc32(*b);
    *d = ror(*d ^ *a, 16);
    *c += *d + 2 * trunc32(*c) * trunc32(*d);
    *b = ror(*b ^ *c, 63);
}